

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O3

MessageLite * __thiscall
google::protobuf::internal::ExtensionSet::ReleaseMessage
          (ExtensionSet *this,int number,MessageLite *prototype)

{
  byte bVar1;
  int iVar2;
  Extension *pEVar3;
  LogMessage *pLVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  int key;
  LogMessage local_70;
  int local_38;
  LogFinisher local_31;
  MessageLite *pMVar5;
  
  pEVar3 = FindOrNull(this,number);
  if (pEVar3 == (Extension *)0x0) {
    pMVar5 = (MessageLite *)0x0;
  }
  else {
    local_38 = number;
    if (pEVar3->is_repeated != false) {
      LogMessage::LogMessage
                (&local_70,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O3/src/src/google/protobuf/extension_set.cc"
                 ,0x2bd);
      pLVar4 = LogMessage::operator<<
                         (&local_70,
                          "CHECK failed: ((*extension).is_repeated ? REPEATED_FIELD : OPTIONAL_FIELD) == (OPTIONAL_FIELD): "
                         );
      LogFinisher::operator=(&local_31,pLVar4);
      LogMessage::~LogMessage(&local_70);
    }
    bVar1 = pEVar3->type;
    if ((byte)(bVar1 - 0x13) < 0xee) {
      LogMessage::LogMessage
                (&local_70,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O3/src/src/google/protobuf/extension_set.cc"
                 ,0x3c);
      pLVar4 = LogMessage::operator<<
                         (&local_70,
                          "CHECK failed: type > 0 && type <= WireFormatLite::MAX_FIELD_TYPE: ");
      LogFinisher::operator=(&local_31,pLVar4);
      LogMessage::~LogMessage(&local_70);
    }
    key = local_38;
    if (*(int *)(WireFormatLite::kFieldTypeToCppTypeMap + (ulong)bVar1 * 4) != 10) {
      LogMessage::LogMessage
                (&local_70,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O3/src/src/google/protobuf/extension_set.cc"
                 ,0x2bd);
      pLVar4 = LogMessage::operator<<
                         (&local_70,
                          "CHECK failed: (cpp_type((*extension).type)) == (WireFormatLite::CPPTYPE_MESSAGE): "
                         );
      LogFinisher::operator=(&local_31,pLVar4);
      key = local_38;
      LogMessage::~LogMessage(&local_70);
    }
    if ((pEVar3->field_0xa & 0x10) == 0) {
      pMVar5 = (pEVar3->field_0).message_value;
      if (this->arena_ != (Arena *)0x0) {
        iVar2 = (*pMVar5->_vptr_MessageLite[3])(pMVar5);
        pMVar5 = (MessageLite *)CONCAT44(extraout_var,iVar2);
        (*pMVar5->_vptr_MessageLite[8])(pMVar5,(pEVar3->field_0).int64_value);
      }
    }
    else {
      iVar2 = (*((pEVar3->field_0).message_value)->_vptr_MessageLite[7])
                        ((pEVar3->field_0).message_value,prototype);
      pMVar5 = (MessageLite *)CONCAT44(extraout_var_00,iVar2);
      if ((this->arena_ == (Arena *)0x0) && ((pEVar3->field_0).message_value != (MessageLite *)0x0))
      {
        (*((pEVar3->field_0).message_value)->_vptr_MessageLite[1])();
      }
    }
    Erase(this,key);
  }
  return pMVar5;
}

Assistant:

MessageLite* ExtensionSet::ReleaseMessage(int number,
                                          const MessageLite& prototype) {
  Extension* extension = FindOrNull(number);
  if (extension == NULL) {
    // Not present.  Return NULL.
    return NULL;
  } else {
    GOOGLE_DCHECK_TYPE(*extension, OPTIONAL_FIELD, MESSAGE);
    MessageLite* ret = NULL;
    if (extension->is_lazy) {
      ret = extension->lazymessage_value->ReleaseMessage(prototype);
      if (arena_ == NULL) {
        delete extension->lazymessage_value;
      }
    } else {
      if (arena_ == NULL) {
        ret = extension->message_value;
      } else {
        // ReleaseMessage() always returns a heap-allocated message, and we are
        // on an arena, so we need to make a copy of this message to return.
        ret = extension->message_value->New();
        ret->CheckTypeAndMergeFrom(*extension->message_value);
      }
    }
    Erase(number);
    return ret;
  }
}